

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O1

boolean can_saddle(monst *mtmp)

{
  char cVar1;
  uint uVar2;
  permonst *ppVar3;
  void *pvVar4;
  bool bVar5;
  
  ppVar3 = mtmp->data;
  cVar1 = ppVar3->mlet;
  pvVar4 = memchr("\x11\x15\x1b\x1d\x1e$",(int)cVar1,7);
  if ((((pvVar4 == (void *)0x0) || (ppVar3->msize < 2)) ||
      (uVar2 = ppVar3->mflags1, cVar1 != '\x1d' && (uVar2 >> 0x11 & 1) != 0)) ||
     ((cVar1 == '6' || (char)((uVar2 & 4) >> 2) != '\0' ||
      (ppVar3 == mons + 0x9f || cVar1 == '\x16')))) {
    bVar5 = false;
  }
  else {
    bVar5 = (uVar2 >> 0x14 & 1) == 0;
  }
  return bVar5;
}

Assistant:

boolean can_saddle(struct monst *mtmp)
{
	const struct permonst *ptr = mtmp->data;

	return (strchr(steeds, ptr->mlet) && (ptr->msize >= MZ_MEDIUM) &&
			(!humanoid(ptr) || ptr->mlet == S_CENTAUR) &&
			!amorphous(ptr) && !noncorporeal(ptr) &&
			!is_whirly(ptr) && !unsolid(ptr));
}